

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O2

_Bool xdr_ncallhdr(XDR *xdrs,rpc_msg *cmsg)

{
  _Bool _Var1;
  bool_t bVar2;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa5,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  if (cmsg != (rpc_msg *)0x0) {
    cmsg->rm_direction = CALL;
    (cmsg->ru).RM_cmb = 2;
    if (xdrs->x_op == XDR_ENCODE) {
      _Var1 = xdr_u_int32_t(xdrs,&cmsg->rm_xid);
      if (_Var1) {
        bVar2 = xdr_enum((XDR *)xdrs,(enum_t *)&cmsg->rm_direction);
        if ((char)bVar2 != '\0') {
          _Var1 = xdr_u_int32_t(xdrs,(u_int32_t *)&cmsg->ru);
          if (_Var1) {
            _Var1 = xdr_u_int32_t(xdrs,&cmsg->cb_prog);
            if (_Var1) {
              _Var1 = xdr_u_int32_t(xdrs,&cmsg->cb_vers);
              return _Var1;
            }
          }
        }
      }
    }
    return false;
  }
  __assert_fail("cmsg != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0xa6,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
}

Assistant:

bool
xdr_ncallhdr(XDR *xdrs, struct rpc_msg *cmsg)
{
	assert(xdrs != NULL);
	assert(cmsg != NULL);

	cmsg->rm_direction = CALL;
	cmsg->rm_call.cb_rpcvers = RPC_MSG_VERSION;
	if ((xdrs->x_op == XDR_ENCODE)
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(cmsg->rm_direction))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_call.cb_rpcvers))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->cb_prog)))
		return (inline_xdr_u_int32_t(xdrs, &(cmsg->cb_vers)));
	return (false);
}